

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiniu_test.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  time_t tVar2;
  UnitTest *this;
  int local_14;
  
  Qiniu_Servend_Init(-1);
  QINIU_ACCESS_KEY = getenv("QINIU_ACCESS_KEY");
  QINIU_SECRET_KEY = getenv("QINIU_SECRET_KEY");
  Test_bucket = getenv("QINIU_TEST_BUCKET");
  Test_Domain = getenv("QINIU_TEST_BUCKET_DOMAIN");
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  testing::InitGoogleTest(&local_14,argv);
  this = testing::UnitTest::GetInstance();
  iVar1 = testing::UnitTest::Run(this);
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
	Qiniu_Servend_Init(-1);
	QINIU_ACCESS_KEY = getenv("QINIU_ACCESS_KEY");
	QINIU_SECRET_KEY = getenv("QINIU_SECRET_KEY");
	Test_bucket = getenv("QINIU_TEST_BUCKET");
	Test_Domain = getenv("QINIU_TEST_BUCKET_DOMAIN");

#ifdef WIN32
	srand(GetTickCount());
#else
	srand(time(NULL));
#endif

	::testing::InitGoogleTest(&argc, argv);

	return RUN_ALL_TESTS();
}